

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poisson.c
# Opt level: O0

double delXSqrdByDelZ(double **X,int i,int j,int z,double alpha,double delz)

{
  uint uVar1;
  int iVar2;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  double in_XMM0_Qa;
  double dVar3;
  double dVar4;
  double in_XMM1_Qa;
  double correctionTerm;
  double df2dz;
  int dy;
  int dx;
  double local_48;
  double local_8;
  
  uVar1 = (uint)(in_ECX == 1);
  iVar2 = 1 - uVar1;
  local_8 = sqr(*(double *)(*(long *)(in_RDI + (long)in_ESI * 8) + (long)in_EDX * 8) +
                *(double *)
                 (*(long *)(in_RDI + (long)(int)(in_ESI + uVar1) * 8) + (long)(in_EDX + iVar2) * 8))
  ;
  dVar3 = sqr(*(double *)
               (*(long *)(in_RDI + (long)(int)(in_ESI - uVar1) * 8) + (long)(in_EDX - iVar2) * 8) +
              *(double *)(*(long *)(in_RDI + (long)in_ESI * 8) + (long)in_EDX * 8));
  local_8 = local_8 - dVar3;
  if ((in_XMM0_Qa != 0.0) || (NAN(in_XMM0_Qa))) {
    local_48 = sqr(*(double *)(*(long *)(in_RDI + (long)in_ESI * 8) + (long)in_EDX * 8));
    dVar3 = sqr(*(double *)
                 (*(long *)(in_RDI + (long)(int)(in_ESI + uVar1) * 8) + (long)(in_EDX + iVar2) * 8))
    ;
    local_48 = local_48 - dVar3;
    if (*(double *)
         (*(long *)(in_RDI + (long)(int)(in_ESI + uVar1) * 8) + (long)(in_EDX + iVar2) * 8) <
        -*(double *)(*(long *)(in_RDI + (long)in_ESI * 8) + (long)in_EDX * 8)) {
      local_48 = local_48 * -1.0;
    }
    dVar3 = in_XMM0_Qa * local_48;
    local_48 = sqr(*(double *)
                    (*(long *)(in_RDI + (long)(int)(in_ESI - uVar1) * 8) +
                    (long)(in_EDX - iVar2) * 8));
    dVar4 = sqr(*(double *)(*(long *)(in_RDI + (long)in_ESI * 8) + (long)in_EDX * 8));
    local_48 = local_48 - dVar4;
    if (*(double *)
         (*(long *)(in_RDI + (long)(int)(in_ESI - uVar1) * 8) + (long)(in_EDX - iVar2) * 8) <
        -*(double *)(*(long *)(in_RDI + (long)in_ESI * 8) + (long)in_EDX * 8)) {
      local_48 = local_48 * -1.0;
    }
    local_8 = -in_XMM0_Qa * local_48 + dVar3 + local_8;
  }
  local_8 = local_8 / (in_XMM1_Qa * 4.0);
  return local_8;
}

Assistant:

REAL delXSqrdByDelZ (REAL **X, int i, int j, int z, REAL alpha, REAL delz)
{
	int dx = (z == DERIVE_BY_X) ? 1 : 0;
	int dy = 1-dx;
	delz *= 4;
	REAL df2dz = sqr(X[i][j] + X[i+dx][j+dy]) - sqr(X[i-dx][j-dy] + X[i][j]);
	if (alpha == 0)
		return df2dz/delz;
	REAL correctionTerm = sqr(X[i][j]) - sqr(X[i+dx][j+dy]);
	if (X[i+dx][j+dy] < -X[i][j])
		correctionTerm *= -1;
	df2dz += alpha*correctionTerm;
	correctionTerm = sqr(X[i-dx][j-dy]) - sqr(X[i][j]);
	if (X[i-dx][j-dy] < - X[i][j])
		correctionTerm *= -1;
	df2dz -= alpha*correctionTerm;
	return df2dz/delz;
}